

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

ssize_t bgzf_raw_read(BGZF *fp,void *data,size_t length)

{
  hFILE *fp_00;
  ssize_t sVar1;
  size_t __n;
  ulong uVar2;
  
  fp_00 = fp->fp;
  uVar2 = (long)fp_00->end - (long)fp_00->begin;
  __n = length;
  if (uVar2 < length) {
    __n = uVar2;
  }
  memcpy(data,fp_00->begin,__n);
  fp_00->begin = fp_00->begin + __n;
  if (uVar2 < length) {
    sVar1 = hread2(fp_00,data,length,__n);
    return sVar1;
  }
  return __n;
}

Assistant:

ssize_t bgzf_raw_read(BGZF *fp, void *data, size_t length)
{
    return hread(fp->fp, data, length);
}